

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

llb_build_key_t * llb_build_key_make(llb_data_t *data)

{
  CAPIBuildKey *this;
  KeyType KStack_58;
  BuildKey local_38;
  
  this = (CAPIBuildKey *)operator_new(0x38);
  llbuild::core::KeyType::KeyType(&KStack_58,(char *)data->data,data->length);
  llbuild::buildsystem::BuildKey::fromData(&local_38,&KStack_58);
  anon_unknown.dwarf_243886::CAPIBuildKey::CAPIBuildKey(this,&local_38);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return (llb_build_key_t *)this;
}

Assistant:

llb_build_key_t *llb_build_key_make(const llb_data_t *data) {
  return (llb_build_key_t *)new CAPIBuildKey(
    BuildKey::fromData(core::KeyType(
      reinterpret_cast<const char*>(data->data), static_cast<size_t>(data->length)
    ))
  );
}